

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedBytes *FB)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  int iVar4;
  uchar *puVar5;
  undefined1 auVar6 [8];
  uchar UC;
  uchar C;
  ulong uVar7;
  unsigned_long *puVar8;
  uint64_t uVar9;
  byte *pbVar10;
  uint uVar11;
  HexPrintStyle Style;
  undefined8 in_R9;
  size_t I;
  uchar *puVar12;
  uchar *puVar13;
  long lVar14;
  uchar *puVar15;
  Optional<unsigned_long> Width;
  Optional<unsigned_long> Width_00;
  ArrayRef<unsigned_char> local_58;
  int local_44;
  undefined1 local_40 [8];
  ArrayRef<unsigned_char> Line;
  
  if ((FB->Bytes).Length != 0) {
    puVar5 = (uchar *)(FB->Bytes).Length;
    local_58 = FB->Bytes;
    bVar1 = FB->Upper;
    uVar9 = (uint64_t)FB->NumPerLine;
    if ((FB->FirstByteOffset).Storage.hasVal == true) {
      uVar7 = (ulong)puVar5 / uVar9;
      puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         (&(FB->FirstByteOffset).Storage);
      uVar9 = (uint64_t)FB->NumPerLine;
      lVar14 = uVar7 * uVar9 + *puVar8;
      uVar7 = lVar14 - 1;
      if (uVar7 == 0) {
        uVar11 = 0x40;
      }
      else {
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar11 = (uint)lVar3 ^ 0x3f;
      }
      Style = 0x43 - uVar11 >> 2;
      if (Style < 5) {
        Style = 4;
      }
      if (lVar14 == 0) {
        Style = 4;
      }
    }
    else {
      Style = Upper;
    }
    uVar11 = bVar1 ^ 1;
    puVar15 = (uchar *)0x0;
    uVar9 = alignTo(uVar9,(ulong)FB->ByteGroupSize,0);
    uVar2 = FB->NumPerLine;
    iVar4 = (int)(uVar9 / FB->ByteGroupSize);
    local_44 = iVar4 + 1 + uVar2 * 2;
    puVar12 = puVar5;
    while (puVar12 != (uchar *)0x0) {
      indent(this,FB->IndentLevel);
      if ((FB->FirstByteOffset).Storage.hasVal == true) {
        puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                           (&(FB->FirstByteOffset).Storage);
        Width.Storage._8_8_ = in_R9;
        Width.Storage.field_0.value = 1;
        llvm::write_hex((llvm *)this,(raw_ostream *)(puVar15 + *puVar8),(ulong)uVar11,Style,Width);
        operator<<(this,": ");
      }
      _local_40 = ArrayRef<unsigned_char>::take_front(&local_58,(ulong)FB->NumPerLine);
      uVar7 = 0;
      for (puVar12 = (uchar *)0x0; puVar12 < Line.Data; puVar12 = puVar12 + 1) {
        if ((puVar12 != (uchar *)0x0) && ((ulong)puVar12 % (ulong)FB->ByteGroupSize == 0)) {
          uVar7 = uVar7 + 1;
          operator<<(this," ");
        }
        pbVar10 = ArrayRef<unsigned_char>::operator[]
                            ((ArrayRef<unsigned_char> *)local_40,(size_t)puVar12);
        Width_00.Storage._8_8_ = in_R9;
        Width_00.Storage.field_0.value = 1;
        llvm::write_hex((llvm *)this,(raw_ostream *)(ulong)*pbVar10,(ulong)uVar11,PrefixUpper,
                        Width_00);
        uVar7 = uVar7 + 2;
      }
      puVar12 = Line.Data;
      if (FB->ASCII != false) {
        if ((iVar4 + uVar2 * 2) - 1 < uVar7) {
          __assert_fail("BlockCharWidth >= CharsPrinted",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                        ,0x1c7,"raw_ostream &llvm::raw_ostream::operator<<(const FormattedBytes &)")
          ;
        }
        indent(this,local_44 - (int)uVar7);
        operator<<(this,"|");
        auVar6 = local_40;
        puVar12 = Line.Data;
        for (puVar13 = (uchar *)0x0; puVar12 != puVar13; puVar13 = puVar13 + 1) {
          C = *(uchar *)((long)auVar6 + (long)puVar13);
          if (0x5e < (byte)(C - 0x20)) {
            C = '.';
          }
          operator<<(this,C);
        }
        operator<<(this,'|');
        puVar12 = Line.Data;
      }
      local_58 = ArrayRef<unsigned_char>::drop_front(&local_58,(size_t)puVar12);
      puVar15 = puVar15 + (long)Line.Data;
      puVar12 = (uchar *)local_58.Length;
      if (puVar15 < puVar5) {
        operator<<(this,'\n');
        puVar12 = (uchar *)local_58.Length;
      }
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedBytes &FB) {
  if (FB.Bytes.empty())
    return *this;

  size_t LineIndex = 0;
  auto Bytes = FB.Bytes;
  const size_t Size = Bytes.size();
  HexPrintStyle HPS = FB.Upper ? HexPrintStyle::Upper : HexPrintStyle::Lower;
  uint64_t OffsetWidth = 0;
  if (FB.FirstByteOffset.hasValue()) {
    // Figure out how many nibbles are needed to print the largest offset
    // represented by this data set, so that we can align the offset field
    // to the right width.
    size_t Lines = Size / FB.NumPerLine;
    uint64_t MaxOffset = *FB.FirstByteOffset + Lines * FB.NumPerLine;
    unsigned Power = 0;
    if (MaxOffset > 0)
      Power = llvm::Log2_64_Ceil(MaxOffset);
    OffsetWidth = std::max<uint64_t>(4, llvm::alignTo(Power, 4) / 4);
  }

  // The width of a block of data including all spaces for group separators.
  unsigned NumByteGroups =
      alignTo(FB.NumPerLine, FB.ByteGroupSize) / FB.ByteGroupSize;
  unsigned BlockCharWidth = FB.NumPerLine * 2 + NumByteGroups - 1;

  while (!Bytes.empty()) {
    indent(FB.IndentLevel);

    if (FB.FirstByteOffset.hasValue()) {
      uint64_t Offset = FB.FirstByteOffset.getValue();
      llvm::write_hex(*this, Offset + LineIndex, HPS, OffsetWidth);
      *this << ": ";
    }

    auto Line = Bytes.take_front(FB.NumPerLine);

    size_t CharsPrinted = 0;
    // Print the hex bytes for this line in groups
    for (size_t I = 0; I < Line.size(); ++I, CharsPrinted += 2) {
      if (I && (I % FB.ByteGroupSize) == 0) {
        ++CharsPrinted;
        *this << " ";
      }
      llvm::write_hex(*this, Line[I], HPS, 2);
    }

    if (FB.ASCII) {
      // Print any spaces needed for any bytes that we didn't print on this
      // line so that the ASCII bytes are correctly aligned.
      assert(BlockCharWidth >= CharsPrinted);
      indent(BlockCharWidth - CharsPrinted + 2);
      *this << "|";

      // Print the ASCII char values for each byte on this line
      for (uint8_t Byte : Line) {
        if (isPrint(Byte))
          *this << static_cast<char>(Byte);
        else
          *this << '.';
      }
      *this << '|';
    }

    Bytes = Bytes.drop_front(Line.size());
    LineIndex += Line.size();
    if (LineIndex < Size)
      *this << '\n';
  }
  return *this;
}